

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.h
# Opt level: O3

void __thiscall ONX_ModelTest::ONX_ModelTest(ONX_ModelTest *this)

{
  long lVar1;
  
  this->m_test_type = Unset;
  ON_wString::ON_wString(&this->m_source_3dm_file_path);
  ON_wString::ON_wString(&this->m_text_log_3dm_file_path);
  lVar1 = 0;
  memset(this->m_model_3dm_file_version,0,0x108);
  do {
    ON_SHA1_Hash::ON_SHA1_Hash((ON_SHA1_Hash *)(this->m_model_hash[0].m_digest + lVar1));
    lVar1 = lVar1 + 0x14;
  } while (lVar1 != 0x3c);
  return;
}

Assistant:

~ONX_ModelTest() = default;